

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void do_gpr_st_memidx(DisasContext_conflict1 *s,TCGv_i64 source,TCGv_i64 tcg_addr,int size,
                     int memidx,_Bool iss_valid,uint iss_srt,_Bool iss_sf,_Bool iss_ar)

{
  uint32_t syn_00;
  uint32_t syn;
  TCGContext_conflict1 *tcg_ctx;
  _Bool iss_ar_local;
  _Bool iss_sf_local;
  _Bool iss_valid_local;
  int memidx_local;
  int size_local;
  TCGv_i64 tcg_addr_local;
  TCGv_i64 source_local;
  DisasContext_conflict1 *s_local;
  
  if (size < 4) {
    tcg_gen_qemu_st_i64_aarch64(s->uc->tcg_ctx,source,tcg_addr,(long)memidx,s->be_data + size);
    if (iss_valid) {
      syn_00 = syn_data_abort_with_iss(0,size,0,iss_srt,(uint)iss_sf,(uint)iss_ar,0,0,0,0,0,false);
      disas_set_insn_syndrome(s,syn_00);
    }
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
             ,0x35f,"size <= 3");
}

Assistant:

static void do_gpr_st_memidx(DisasContext *s, TCGv_i64 source,
                             TCGv_i64 tcg_addr, int size, int memidx,
                             bool iss_valid,
                             unsigned int iss_srt,
                             bool iss_sf, bool iss_ar)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    g_assert(size <= 3);
    tcg_gen_qemu_st_i64(tcg_ctx, source, tcg_addr, memidx, s->be_data + size);

    if (iss_valid) {
        uint32_t syn;

        syn = syn_data_abort_with_iss(0,
                                      size,
                                      false,
                                      iss_srt,
                                      iss_sf,
                                      iss_ar,
                                      0, 0, 0, 0, 0, false);
        disas_set_insn_syndrome(s, syn);
    }
}